

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int BIO_s_custom_read(BIO *bio,char *dst,int length)

{
  long *plVar1;
  uint in_EDX;
  void *in_RSI;
  BIO *in_RDI;
  loop_ssl_data *loop_ssl_data;
  uint local_1c;
  uint local_4;
  
  plVar1 = (long *)BIO_get_data(in_RDI);
  if ((int)plVar1[2] == 0) {
    BIO_set_flags(in_RDI,9);
    local_4 = 0xffffffff;
  }
  else {
    local_1c = in_EDX;
    if (*(uint *)(plVar1 + 2) < in_EDX) {
      local_1c = *(uint *)(plVar1 + 2);
    }
    memcpy(in_RSI,(void *)(*plVar1 + (ulong)*(uint *)((long)plVar1 + 0x14)),(long)(int)local_1c);
    *(uint *)((long)plVar1 + 0x14) = local_1c + *(int *)((long)plVar1 + 0x14);
    *(uint *)(plVar1 + 2) = (int)plVar1[2] - local_1c;
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

int BIO_s_custom_read(BIO *bio, char *dst, int length) {
    struct loop_ssl_data *loop_ssl_data = (struct loop_ssl_data *) BIO_get_data(bio);

    //printf("BIO_s_custom_read\n");

    if (!loop_ssl_data->ssl_read_input_length) {
        BIO_set_flags(bio, BIO_FLAGS_SHOULD_RETRY | BIO_FLAGS_READ);
        return -1;
    }

    if ((unsigned int) length > loop_ssl_data->ssl_read_input_length) {
        length = loop_ssl_data->ssl_read_input_length;
    }

    memcpy(dst, loop_ssl_data->ssl_read_input + loop_ssl_data->ssl_read_input_offset, length);

    loop_ssl_data->ssl_read_input_offset += length;
    loop_ssl_data->ssl_read_input_length -= length;
    return length;
}